

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Node::Content::~Content(Content *this)

{
  kj::Array<capnp::schema::Node::SourceInfo::Reader>::~Array(&this->sourceInfo);
  kj::Array<capnp::schema::Node::Reader>::~Array(&this->auxSchemas);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
  ::~_Rb_tree(&(this->aliases)._M_t);
  kj::ArrayBuilder<capnp::compiler::Compiler::Node_*>::dispose(&(this->orderedNestedNodes).builder);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
  ::~_Rb_tree(&(this->nestedNodes)._M_t);
  return;
}

Assistant:

inline Content(): state(STUB) {}